

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.cc
# Opt level: O3

GLuint hmi::anon_unknown_0::compile_shader(char *code,GLenum type)

{
  GLint GVar1;
  GLuint GVar2;
  char *__s;
  size_t sVar3;
  GLint info_log_length;
  GLint compile_status;
  char *source [1];
  GLint local_28;
  GLint local_24;
  char *local_20;
  
  GVar2 = (*glad_glCreateShader)(type);
  if (GVar2 != 0) {
    local_20 = code;
    (*glad_glShaderSource)(GVar2,1,&local_20,(GLint *)0x0);
    (*glad_glCompileShader)(GVar2);
    local_24 = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b81,&local_24);
    if (local_24 != 0) {
      return GVar2;
    }
    local_28 = 0;
    (*glad_glGetShaderiv)(GVar2,0x8b84,&local_28);
    GVar1 = local_28;
    if ((long)local_28 < 1) {
      __assert_fail("info_log_length > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/jube[P]std_hmi/src/renderer.cc"
                    ,0x46,"GLuint hmi::(anonymous namespace)::compile_shader(const char *, GLenum)")
      ;
    }
    __s = (char *)operator_new__((long)local_28);
    (*glad_glGetShaderInfoLog)(GVar2,GVar1,(GLsizei *)0x0,__s);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error while compiling shader: ",0x1e);
    sVar3 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar3);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x30);
    std::ostream::put(-0x30);
    std::ostream::flush();
    operator_delete__(__s);
  }
  return 0;
}

Assistant:

GLuint compile_shader(const char *code, GLenum type) {
      GLuint id = glCreateShader(type);

      if (id == 0) {
        return 0;
      }

      // compile
      const char *source[1] = { code };
      glShaderSource(id, 1, source, nullptr);
      glCompileShader(id);

      // and check
      GLint compile_status = GL_FALSE;
      glGetShaderiv(id, GL_COMPILE_STATUS, &compile_status);

      if (compile_status == GL_FALSE) {
        GLint info_log_length = 0;
        glGetShaderiv(id, GL_INFO_LOG_LENGTH, &info_log_length);

        assert(info_log_length > 0);
        std::unique_ptr<char[]> info_log(new char[info_log_length]);
        glGetShaderInfoLog(id, info_log_length, nullptr, info_log.get());

        std::cerr << "Error while compiling shader: " << info_log.get() << std::endl;
        return 0;
      }

      return id;
    }